

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_constructor.c
# Opt level: O0

int constructor_compare(constructor ctor,type_id *args,size_t size)

{
  int iVar1;
  type_id tVar2;
  constructor in_RDX;
  long in_RSI;
  long in_RDI;
  type t;
  size_t iterator;
  type in_stack_ffffffffffffffd0;
  constructor ctor_00;
  int local_4;
  
  if (in_RDI == 0) {
    local_4 = 1;
  }
  else if (*(constructor *)(in_RDI + 0x10) == in_RDX) {
    for (ctor_00 = (constructor)0x0; ctor_00 < in_RDX;
        ctor_00 = (constructor)((long)&ctor_00->visibility + 1)) {
      in_stack_ffffffffffffffd0 = constructor_get_type(ctor_00,(size_t)in_stack_ffffffffffffffd0);
      iVar1 = *(int *)(in_RSI + (long)ctor_00 * 4);
      tVar2 = type_index(in_stack_ffffffffffffffd0);
      if (iVar1 != tVar2) {
        return 1;
      }
    }
    local_4 = 0;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int constructor_compare(constructor ctor, type_id args[], size_t size)
{
	size_t iterator;

	if (ctor == NULL)
	{
		return 1;
	}

	if (ctor->count != size)
	{
		return 1;
	}

	for (iterator = 0; iterator < size; ++iterator)
	{
		type t = constructor_get_type(ctor, iterator);

		if (args[iterator] != type_index(t))
		{
			return 1;
		}
	}

	return 0;
}